

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O2

void relink_light_sources(boolean ghostly,level *lev)

{
  boolean bVar1;
  ulong in_RAX;
  monst *pmVar2;
  undefined8 uVar3;
  ls_t *plVar4;
  undefined4 uStack_38;
  uint nid;
  
  plVar4 = (ls_t *)&lev->lev_lights;
  _uStack_38 = in_RAX;
  while (plVar4 = plVar4->next, plVar4 != (ls_t *)0x0) {
    if ((plVar4->flags & 2) != 0) {
      if ((ushort)plVar4->type < 2) {
        if (ghostly == '\0') {
          _uStack_38 = CONCAT44(*(uint *)&plVar4->id,uStack_38);
        }
        else {
          bVar1 = lookup_id_mapping(*(uint *)&plVar4->id,&nid);
          if (bVar1 == '\0') {
            impossible("relink_light_sources: no id mapping");
          }
        }
        if (plVar4->type == 0) {
          pmVar2 = (monst *)find_oid(lev,nid);
          uVar3 = 0x6f;
        }
        else {
          pmVar2 = find_mid(lev,nid,7);
          uVar3 = 0x6d;
        }
        plVar4->id = pmVar2;
        if (pmVar2 == (monst *)0x0) {
          impossible("relink_light_sources: cant find %c_id %d",uVar3,_uStack_38 >> 0x20);
        }
      }
      else {
        impossible("relink_light_sources: bad type (%d)");
      }
      *(byte *)&plVar4->flags = (byte)plVar4->flags & 0xfd;
    }
  }
  return;
}

Assistant:

void relink_light_sources(boolean ghostly, struct level *lev)
{
    char which;
    unsigned nid;
    light_source *ls;

    for (ls = lev->lev_lights; ls; ls = ls->next) {
	if (ls->flags & LSF_NEEDS_FIXUP) {
	    if (ls->type == LS_OBJECT || ls->type == LS_MONSTER) {
		if (ghostly) {
		    if (!lookup_id_mapping((long)ls->id, &nid))
			impossible("relink_light_sources: no id mapping");
		} else
		    nid = (long) ls->id;
		if (ls->type == LS_OBJECT) {
		    which = 'o';
		    ls->id = find_oid(lev, nid);
		} else {
		    which = 'm';
		    ls->id = find_mid(lev, nid, FM_EVERYWHERE);
		}
		if (!ls->id)
		    impossible("relink_light_sources: cant find %c_id %d",
			       which, nid);
	    } else
		impossible("relink_light_sources: bad type (%d)", ls->type);

	    ls->flags &= ~LSF_NEEDS_FIXUP;
	}
    }
}